

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineForTarget.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
* __thiscall
Machine::TargetsByMachineName_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>_>
           *__return_storage_ptr__,Machine *this,bool meaningful_without_media_only)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Target *pTVar4;
  Machine machine;
  Machine machine_00;
  Machine machine_01;
  Machine machine_02;
  Machine machine_03;
  Machine machine_04;
  Machine machine_05;
  Machine machine_06;
  Machine machine_07;
  Machine machine_08;
  Machine machine_09;
  Machine machine_10;
  Machine machine_11;
  Machine machine_12;
  Machine machine_13;
  Machine machine_14;
  undefined7 in_register_00000011;
  string local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Enterprise::Target_*>
  local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  LongNameForTargetMachine_abi_cxx11_
            (&local_70,(Machine *)0x5,
             (Machine)CONCAT71(in_register_00000011,meaningful_without_media_only));
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::Amiga::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  paVar2 = &local_50.first.field_2;
  paVar3 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Amiga::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Amiga::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x0,machine);
  pTVar4 = (Target *)operator_new(0xb0);
  Analyser::Static::AmstradCPC::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AmstradCPC::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AmstradCPC::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x1,machine_00);
  pTVar4 = (Target *)operator_new(0x98);
  Analyser::Static::AppleII::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AppleII::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleII::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x2,machine_01);
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::AppleIIgs::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AppleIIgs::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AppleIIgs::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x4,machine_02);
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::AtariST::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::AtariST::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::AtariST::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x7,machine_03);
  pTVar4 = (Target *)operator_new(0xb0);
  Analyser::Static::Acorn::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Acorn::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Acorn::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x8,machine_04);
  pTVar4 = (Target *)operator_new(0xc0);
  Analyser::Static::Enterprise::Target::Target(pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Enterprise::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x9,machine_05);
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::Macintosh::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Macintosh::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Macintosh::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xb,machine_06);
  pTVar4 = (Target *)operator_new(0xb8);
  Analyser::Static::MSX::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::MSX::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::MSX::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xc,machine_07);
  pTVar4 = (Target *)operator_new(0xc0);
  Analyser::Static::Oric::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Oric::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Oric::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xd,machine_08);
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::PCCompatible::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::PCCompatible::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::PCCompatible::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xe,machine_09);
  pTVar4 = (Target *)operator_new(0xb8);
  Analyser::Static::Commodore::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Commodore::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Commodore::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xf,machine_10);
  pTVar4 = (Target *)operator_new(0xb0);
  Analyser::Static::ZX8081::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::ZX8081::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZX8081::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x10,machine_11);
  pTVar4 = (Target *)operator_new(0x90);
  Analyser::Static::ZXSpectrum::Target::Target((Target *)pTVar4);
  local_50.first._M_string_length = local_70._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_70.field_2._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar3;
  local_50.second = pTVar4;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::ZXSpectrum::Target*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
              *)__return_storage_ptr__,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::ZXSpectrum::Target_*>
              *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if ((char)this == '\0') {
    LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x3,machine_12);
    local_50.second = (Target *)operator_new(0x88);
    local_50.first._M_string_length = local_70._M_string_length;
    ((local_50.second)->super_Target).state._M_t.
    super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
    super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
    super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
    ((local_50.second)->super_Target).machine = Atari2600;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&((local_50.second)->super_Target).confidence = 0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00579430;
    *(undefined1 *)
     &((local_50.second)->super_StructImpl<Analyser::Static::Enterprise::Target>).super_Struct.
      _vptr_Struct = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar3) {
      local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
      local_50.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_50.first.field_2._M_allocated_capacity._1_7_ =
         local_70.field_2._M_allocated_capacity._1_7_;
    local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Atari2600::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Atari2600::Target_*>
                *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0x6,machine_13);
    local_50.second = (Target *)operator_new(0x80);
    local_50.first._M_string_length = local_70._M_string_length;
    ((local_50.second)->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00578fe0;
    ((local_50.second)->super_Target).state._M_t.
    super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
    super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
    super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)0x0;
    ((local_50.second)->super_Target).machine = ColecoVision;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.disks.
    super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.tapes.
    super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.cartridges.
    super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_50.second)->super_Target).confidence = 0.0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_50.second)->super_Target).media.mass_storage_devices.
    super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar3) {
      local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
      local_50.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_50.first.field_2._M_allocated_capacity._1_7_ =
         local_70.field_2._M_allocated_capacity._1_7_;
    local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Target_*>
                *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    LongNameForTargetMachine_abi_cxx11_(&local_70,(Machine *)0xa,machine_14);
    pTVar4 = (Target *)operator_new(0x98);
    Analyser::Static::Sega::Target::Target((Target *)pTVar4);
    local_50.first._M_string_length = local_70._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar3) {
      local_50.first.field_2._8_8_ = local_70.field_2._8_8_;
      local_50.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.first._M_dataplus._M_p = local_70._M_dataplus._M_p;
    }
    local_50.first.field_2._M_allocated_capacity._1_7_ =
         local_70.field_2._M_allocated_capacity._1_7_;
    local_50.first.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar3;
    local_50.second = pTVar4;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Analyser::Static::Sega::Target*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>>
                *)__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Analyser::Static::Sega::Target_*>
                *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::unique_ptr<Analyser::Static::Target>> Machine::TargetsByMachineName(bool meaningful_without_media_only) {
	std::map<std::string, std::unique_ptr<Analyser::Static::Target>> options;

#define AddMapped(Name, TargetNamespace)	\
	options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::Name), new Analyser::Static::TargetNamespace::Target));
#define Add(Name)	AddMapped(Name, Name)

	Add(Amiga);
	Add(AmstradCPC);
	Add(AppleII);
	Add(AppleIIgs);
	Add(AtariST);
	AddMapped(Electron, Acorn);
	Add(Enterprise);
	Add(Macintosh);
	Add(MSX);
	Add(Oric);
	Add(PCCompatible);
	AddMapped(Vic20, Commodore);
	Add(ZX8081);
	Add(ZXSpectrum);

	if(!meaningful_without_media_only) {
		Add(Atari2600);
		options.emplace(std::make_pair(LongNameForTargetMachine(Analyser::Machine::ColecoVision), new Analyser::Static::Target(Analyser::Machine::ColecoVision)));
		AddMapped(MasterSystem, Sega);
	}

#undef Add
#undef AddMapped

	return options;
}